

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<std::__cxx11::string,false>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  string *psVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  size_t sVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  string *psVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  string *psVar20;
  void *__nmemb;
  ulong uVar21;
  int iVar22;
  string *psVar23;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  uint32_t *local_98;
  void *local_90;
  size_t local_88;
  void *local_80;
  string *local_78;
  size_t local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  void *local_48;
  string *local_40;
  phf_seed_t local_34;
  
  __nmemb = (void *)(n + (n == 0));
  uVar14 = l + (l == 0);
  sVar19 = 100;
  if (a < 100) {
    sVar19 = a;
  }
  phf->nodiv = false;
  local_34 = seed;
  sVar11 = phf_primeup(((long)__nmemb + (uVar14 - 1)) / uVar14);
  local_70 = phf_primeup((ulong)((long)__nmemb * 100) / (sVar19 + (sVar19 == 0)));
  if (local_70 == 0 || sVar11 == 0) {
    return 0x22;
  }
  local_88 = sVar11;
  local_78 = (string *)calloc((size_t)__nmemb,0x30);
  if ((local_78 == (string *)0x0) || (local_80 = calloc(local_88,8), local_80 == (void *)0x0)) {
    local_48 = (void *)0x0;
    local_80 = (void *)0x0;
  }
  else {
    local_90 = __nmemb;
    local_40 = (string *)n;
    if (n != 0) {
      psVar20 = local_78;
      do {
        local_118 = local_108;
        pcVar3 = (k->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar3,pcVar3 + k->_M_string_length);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_118,local_118 + local_110);
        uVar9 = phf_g<std::__cxx11::string>(&local_68,local_34);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_88;
        lVar15 = SUB168(ZEXT416(uVar9) % auVar4,0);
        if (local_118 != local_108) {
          operator_delete(local_118);
        }
        std::__cxx11::string::_M_assign(psVar20);
        *(int *)(psVar20 + 0x20) = SUB164(ZEXT416(uVar9) % auVar4,0);
        plVar1 = (long *)((long)local_80 + lVar15 * 8);
        *plVar1 = *plVar1 + 1;
        *(void **)(psVar20 + 0x28) = (void *)((long)local_80 + lVar15 * 8);
        psVar20 = psVar20 + 0x30;
        k = k + 1;
        n = n - 1;
      } while (n != 0);
    }
    qsort(local_78,(size_t)local_90,0x30,phf_keycmp<std::__cxx11::string>);
    uVar14 = local_70 + 0x3f >> 6;
    local_48 = calloc(uVar14 * 2,8);
    if (local_48 == (void *)0x0) {
      local_48 = (void *)0x0;
    }
    else {
      local_98 = (uint32_t *)calloc(local_88,4);
      if (local_98 != (uint32_t *)0x0) {
        if ((long)local_40 < 1) {
          uVar14 = 0;
        }
        else {
          local_90 = (void *)((long)local_48 + uVar14 * 8);
          psVar16 = local_78 + (long)local_40 * 0x30;
          uVar14 = 0;
          psVar20 = local_78;
          do {
            if (**(long **)(psVar20 + 0x28) == 0) break;
            lVar15 = **(long **)(psVar20 + 0x28);
            psVar23 = psVar20 + lVar15 * 0x30;
            uVar21 = 1;
            while (uVar9 = (uint32_t)uVar21, local_40 = psVar20, psVar8 = psVar20, 0 < lVar15) {
              while( true ) {
                local_f8 = local_e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,*(long *)psVar20,
                           *(long *)(psVar20 + 8) + *(long *)psVar20);
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,local_f8,local_f8 + local_f0);
                uVar10 = phf_f<std::__cxx11::string>(uVar9,&local_68,local_34);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p);
                }
                uVar17 = (ulong)uVar10 % local_70;
                if (local_f8 != local_e8) {
                  operator_delete(local_f8);
                }
                uVar12 = uVar17 >> 6;
                uVar18 = 1L << ((byte)uVar17 & 0x3f);
                psVar8 = local_40;
                if (((*(ulong *)((long)local_48 + uVar12 * 8) >> (uVar17 & 0x3f) & 1) != 0) ||
                   (uVar17 = *(ulong *)((long)local_90 + uVar12 * 8), (uVar17 & uVar18) != 0))
                break;
                *(ulong *)((long)local_90 + uVar12 * 8) = uVar17 | uVar18;
                psVar20 = psVar20 + 0x30;
                if (psVar23 <= psVar20) goto joined_r0x0015867a;
              }
              for (; psVar8 < psVar23; psVar8 = psVar8 + 0x30) {
                local_d8 = local_c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,*(long *)psVar8,
                           *(long *)(psVar8 + 8) + *(long *)psVar8);
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,local_d8,local_d8 + local_d0);
                uVar10 = phf_f<std::__cxx11::string>(uVar9,&local_68,local_34);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p);
                }
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_70;
                if (local_d8 != local_c8) {
                  operator_delete(local_d8);
                }
                bVar7 = SUB161(ZEXT416(uVar10) % auVar5,0) & 0x3f;
                puVar2 = (ulong *)((long)local_90 + (SUB168(ZEXT416(uVar10) % auVar5,0) >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              uVar21 = uVar21 + 1;
              lVar15 = **(long **)(local_40 + 0x28);
              psVar23 = local_40 + lVar15 * 0x30;
              psVar20 = local_40;
            }
joined_r0x0015867a:
            for (; psVar8 < psVar23; psVar8 = psVar8 + 0x30) {
              local_b8 = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)psVar8,*(long *)(psVar8 + 8) + *(long *)psVar8
                        );
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_68,local_b8,local_b8 + local_b0);
              uVar10 = phf_f<std::__cxx11::string>(uVar9,&local_68,local_34);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p);
              }
              auVar6._8_8_ = 0;
              auVar6._0_8_ = local_70;
              if (local_b8 != local_a8) {
                operator_delete(local_b8);
              }
              puVar2 = (ulong *)((long)local_48 + (SUB168(ZEXT416(uVar10) % auVar6,0) >> 6) * 8);
              *puVar2 = *puVar2 | 1L << (SUB161(ZEXT416(uVar10) % auVar6,0) & 0x3f);
            }
            uVar14 = uVar14 & 0xffffffff;
            if (uVar14 < uVar21) {
              uVar14 = uVar21;
            }
            local_98[*(uint *)(local_40 + 0x20)] = uVar9;
            psVar20 = local_40 + **(long **)(local_40 + 0x28) * 0x30;
          } while (psVar20 < psVar16);
          uVar14 = uVar14 & 0xffffffff;
        }
        iVar22 = 0;
        phf->seed = local_34;
        phf->r = local_88;
        phf->m = local_70;
        phf->g = local_98;
        phf->d_max = uVar14;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00158792;
      }
    }
  }
  piVar13 = __errno_location();
  iVar22 = *piVar13;
LAB_00158792:
  free(local_48);
  free(local_80);
  free(local_78);
  return iVar22;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}